

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

void cmELFByteSwap(undefined1 *data)

{
  ushort *puVar1;
  undefined1 uVar2;
  ushort uVar3;
  
  uVar2 = *data;
  *data = data[7];
  data[7] = uVar2;
  uVar3 = *(ushort *)(data + 1);
  *(ushort *)(data + 1) = *(ushort *)(data + 5) << 8 | *(ushort *)(data + 5) >> 8;
  *(ushort *)(data + 5) = uVar3 << 8 | uVar3 >> 8;
  puVar1 = (ushort *)(data + 3);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  return;
}

Assistant:

void cmELFByteSwap(char* data, cmELFByteSwapSize<8> /*unused*/)
{
  char one_byte;
  one_byte = data[0];
  data[0] = data[7];
  data[7] = one_byte;
  one_byte = data[1];
  data[1] = data[6];
  data[6] = one_byte;
  one_byte = data[2];
  data[2] = data[5];
  data[5] = one_byte;
  one_byte = data[3];
  data[3] = data[4];
  data[4] = one_byte;
}